

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printLine<unsigned_int,unsigned_long>(char *text,uint *args,unsigned_long *args_1)

{
  unsigned_long *in_R8;
  string_view text_00;
  undefined1 auVar1 [16];
  undefined1 local_40 [8];
  string message;
  unsigned_long *args_local_1;
  uint *args_local;
  char *text_local;
  
  message.field_2._8_8_ = args_1;
  tinyformat::format<unsigned_int,unsigned_long>
            ((string *)local_40,(tinyformat *)text,(char *)args,(uint *)args_1,in_R8);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  text_00._M_str = auVar1._8_8_;
  text_00._M_len = (size_t)text_00._M_str;
  printLine(auVar1._0_8_,text_00);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}